

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O2

void cs_impl::array_cs_ext::push_front(array *arr,var *val)

{
  any aStack_18;
  any local_10;
  
  local_10.mDat = val->mDat;
  if (local_10.mDat != (proxy *)0x0) {
    (local_10.mDat)->refcount = (local_10.mDat)->refcount + 1;
  }
  cs::copy((EVP_PKEY_CTX *)&aStack_18,(EVP_PKEY_CTX *)&local_10);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_front<cs_impl::any>
            (arr,&aStack_18);
  any::recycle(&aStack_18);
  any::recycle(&local_10);
  return;
}

Assistant:

void push_front(array &arr, const var &val)
		{
			arr.push_front(copy(val));
		}